

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::format_decimal<long_long>(char **buffer,longlong value)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  type_conflict4 tVar3;
  int value_00;
  type tVar4;
  ulong in_RSI;
  long *in_RDI;
  int num_digits;
  uint index;
  main_type abs_value;
  char *pcVar5;
  undefined4 in_stack_ffffffffffffffe4;
  ulong local_18;
  
  tVar3 = internal::is_negative<long_long>(in_RSI);
  local_18 = in_RSI;
  if (tVar3) {
    puVar2 = (undefined1 *)*in_RDI;
    *in_RDI = (long)(puVar2 + 1);
    *puVar2 = 0x2d;
    local_18 = -in_RSI;
  }
  if (local_18 < 100) {
    if (local_18 < 10) {
      pcVar5 = (char *)*in_RDI;
      *in_RDI = (long)(pcVar5 + 1);
      *pcVar5 = (char)local_18 + '0';
    }
    else {
      uVar1 = internal::basic_data<void>::DIGITS[local_18 << 1 & 0xffffffff];
      puVar2 = (undefined1 *)*in_RDI;
      *in_RDI = (long)(puVar2 + 1);
      *puVar2 = uVar1;
      uVar1 = internal::basic_data<void>::DIGITS[(int)(local_18 << 1) + 1];
      puVar2 = (undefined1 *)*in_RDI;
      *in_RDI = (long)(puVar2 + 1);
      *puVar2 = uVar1;
    }
  }
  else {
    value_00 = internal::count_digits(local_18);
    pcVar5 = (char *)*in_RDI;
    tVar4 = internal::to_unsigned<int>(value_00);
    internal::make_checked<char>(pcVar5,(ulong)tVar4);
    internal::format_decimal<char,char*,unsigned_long>
              ((char *)CONCAT44(in_stack_ffffffffffffffe4,value_00),(unsigned_long)pcVar5,0);
    *in_RDI = *in_RDI + (long)value_00;
  }
  return;
}

Assistant:

inline void format_decimal(char *&buffer, T value) {
  typedef typename internal::int_traits<T>::main_type main_type;
  main_type abs_value = static_cast<main_type>(value);
  if (internal::is_negative(value)) {
    *buffer++ = '-';
    abs_value = 0 - abs_value;
  }
  if (abs_value < 100) {
    if (abs_value < 10) {
      *buffer++ = static_cast<char>('0' + abs_value);
      return;
    }
    unsigned index = static_cast<unsigned>(abs_value * 2);
    *buffer++ = internal::data::DIGITS[index];
    *buffer++ = internal::data::DIGITS[index + 1];
    return;
  }
  int num_digits = internal::count_digits(abs_value);
  internal::format_decimal<char>(
        internal::make_checked(buffer, internal::to_unsigned(num_digits)), abs_value, num_digits);
  buffer += num_digits;
}